

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  *(undefined ***)this = &PTR__ExceptionImpl_0027f178;
  pcVar1 = (this->whatBuffer).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->whatBuffer).content.size_;
    (this->whatBuffer).content.ptr = (char *)0x0;
    (this->whatBuffer).content.size_ = 0;
    pAVar3 = (this->whatBuffer).content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  std::exception::~exception(&this->super_exception);
  Exception::~Exception(&this->super_Exception);
  operator_delete(this,0x178);
  return;
}

Assistant:

ExceptionImpl(const ExceptionImpl& other): Exception(other) {
    // No need to copy whatBuffer since it's just to hold the return value of what().
  }